

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O3

void __thiscall pg::TLQSolver::solve(TLQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  pointer *pppbVar1;
  uint64_t **ppuVar2;
  _label_vertex *lv;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  bitset *R;
  pointer ppbVar7;
  bitset *Z;
  bitset *pbVar8;
  uint64_t uVar9;
  pointer piVar10;
  uint *puVar11;
  char cVar12;
  undefined8 Z_00;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  ostream *poVar18;
  long *plVar19;
  size_t sVar20;
  pointer ppbVar21;
  void *pvVar22;
  void *__dest;
  long lVar23;
  int *piVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  byte bVar28;
  ulong uVar29;
  iterator iVar30;
  size_t sVar31;
  uint64_t *puVar32;
  uint64_t *puVar33;
  ulong uVar34;
  bitset k_U;
  bitset H;
  ulong local_158;
  undefined1 local_148 [80];
  bitset local_f8;
  undefined8 local_d8;
  int *piStack_d0;
  undefined1 local_c8 [128];
  int *local_48;
  int *piStack_40;
  
  local_158 = (ulong)(uint)vtop;
  this->iterations = this->iterations + 1;
  if (po < 1) {
    sVar17 = (this->W0)._bitssize;
    if (sVar17 != 0) {
      puVar33 = (this->W0)._bits;
      sVar20 = 0;
      puVar32 = SG->_bits;
      do {
        puVar3 = puVar33 + sVar20;
        *puVar3 = *puVar3 | puVar32[sVar20];
        sVar20 = sVar20 + 1;
      } while (sVar17 != sVar20);
    }
    if ((this->super_Solver).trace < 2) {
      return;
    }
    sVar17 = 0;
    do {
      if (SG->_bitssize == sVar17) {
        return;
      }
      puVar33 = SG->_bits + sVar17;
      sVar17 = sVar17 + 1;
    } while (*puVar33 == 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"presumed won by player 0:",0x19);
    if (-1 < vtop) {
      uVar34 = (ulong)(uint)vtop;
      do {
        if ((SG->_bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) {
          poVar18 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
          local_c8._0_8_ = (this->super_Solver).game;
          local_c8._8_4_ = (int)uVar34;
          poVar18 = operator<<(poVar18,(_label_vertex *)local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        }
        bVar13 = 0 < (long)uVar34;
        uVar34 = uVar34 - 1;
      } while (bVar13);
    }
  }
  else {
    uVar34 = (ulong)(uint)pe;
    if (0 < pe) {
      uVar29 = (ulong)vtop;
      uVar27 = (ulong)(uint)po;
      if (((SG->_bits[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) == 0) &&
         (local_158 = bitset::find_prev(SG,uVar29), (int)local_158 == -1)) {
        return;
      }
      iVar30._M_current =
           (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      local_c8._104_8_ = &this->Ps;
      uVar29 = (ulong)(int)local_158;
      if ((ulong)((long)iVar30._M_current -
                  (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <
          (ulong)((long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar15 = ((this->super_Solver).game)->_priority[uVar29];
        local_c8._0_4_ = iVar15;
        if (iVar30._M_current ==
            (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_c8._104_8_,iVar30,(int *)local_c8);
        }
        else {
          *iVar30._M_current = iVar15;
          (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar30._M_current + 1;
        }
        sVar17 = bitset::count(SG);
        do {
          po = (int)uVar27;
          uVar27 = uVar27 >> 1;
        } while (sVar17 < uVar27);
        do {
          pe = (int)uVar34;
          uVar34 = uVar34 >> 1;
        } while (sVar17 < uVar34);
        iVar30._M_current =
             (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      local_148._44_4_ = iVar30._M_current[-1];
      if ((local_148._44_4_ & 1) == 0) {
        uVar14 = pe;
        uVar26 = (uint)po >> 1;
      }
      else {
        uVar14 = (uint)pe >> 1;
        uVar26 = po;
      }
      local_148._72_4_ = po;
      local_148._76_4_ = pe;
      solve(this,SG,(int)local_158,uVar14,uVar26);
      uVar14 = local_148._44_4_ & 1;
      if (1 < (this->super_Solver).trace) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"in pr=",6);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._44_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", pe=",5);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._76_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", po=",5);
        plVar19 = (long *)std::ostream::operator<<(poVar18,local_148._72_4_);
        std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
        std::ostream::put((char)plVar19);
        std::ostream::flush();
      }
      local_c8._40_8_ = &this->W1;
      local_c8._48_8_ = &this->W0;
      local_c8._64_8_ = local_c8._40_8_;
      if (uVar14 == 0) {
        local_c8._64_8_ = local_c8._48_8_;
      }
      local_148._56_8_ = local_c8._48_8_;
      if (uVar14 == 0) {
        local_148._56_8_ = local_c8._40_8_;
      }
      if (((SG->_bits[uVar29 >> 6] >> (local_158 & 0x3f) & 1) == 0) &&
         (local_158 = bitset::find_prev(SG,uVar29), (int)local_158 == -1)) {
        return;
      }
      local_c8._8_8_ = ((this->super_Solver).game)->n_vertices;
      uVar34 = local_c8._8_8_ + 0x3f;
      local_c8._16_8_ = uVar34 >> 6;
      puVar33 = (uint64_t *)(local_c8._16_8_ << 3);
      local_c8._24_8_ = puVar33;
      local_c8._0_8_ = operator_new__((ulong)puVar33);
      if (0x3f < uVar34) {
        memset((void *)local_c8._0_8_,0,(size_t)puVar33);
      }
      local_148._0_8_ = local_c8;
      local_c8._112_8_ = &this->Hs;
      std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
                ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)local_c8._112_8_,
                 (bitset **)local_148);
      iVar15 = (int)local_158;
      local_148._0_4_ = iVar15;
      if (iVar15 != -1) {
        local_d8 = (vector<int,std::allocator<int>> *)&this->heads;
        uVar34 = local_158;
        do {
          iVar16 = (int)uVar34;
          uVar27 = (ulong)(long)iVar16 >> 6;
          if (((SG->_bits[uVar27] >> (uVar34 & 0x3f) & 1) != 0) &&
             ((((long *)local_c8._0_8_)[uVar27] & 1L << (uVar34 & 0x3f)) == 0)) {
            if ((((this->super_Solver).game)->_priority[iVar16] & 1U) != uVar14) break;
            iVar30._M_current =
                 (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar30._M_current ==
                (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_d8,iVar30,(int *)local_148);
            }
            else {
              *iVar30._M_current = iVar16;
              (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar30._M_current + 1;
            }
            uVar34 = (ulong)(int)local_148._0_4_;
            ((long *)local_c8._0_8_)[uVar34 >> 6] =
                 ((long *)local_c8._0_8_)[uVar34 >> 6] | 1L << (uVar34 & 0x3f);
            this->str[uVar34] = -1;
            iVar16 = (this->Q).pointer;
            (this->Q).pointer = iVar16 + 1;
            (this->Q).queue[iVar16] = local_148._0_4_;
            while( true ) {
              iVar16 = (this->Q).pointer;
              if ((long)iVar16 == 0) break;
              (this->Q).pointer = iVar16 + -1;
              uVar4 = (this->Q).queue[(long)iVar16 + -1];
              attractVertices(this,uVar14,uVar4,(bitset *)local_c8,SG,SG);
              attractTangles(this,uVar14,uVar4,SG,(bitset *)local_c8,SG);
            }
            iVar16 = local_148._0_4_;
          }
          uVar34 = (ulong)(iVar16 - 1U);
          local_148._0_4_ = iVar16 - 1U;
        } while (iVar16 != 0);
      }
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[1;33mregion \x1b[36m",0x13)
        ;
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._44_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        sVar17 = 0xffffffffffffffff;
        if (local_c8._16_8_ != 0) {
          lVar23 = local_c8._16_8_ * -0x40;
          uVar34 = local_c8._16_8_;
          do {
            lVar23 = lVar23 + 0x40;
            lVar6 = *(long *)(local_c8._0_8_ + uVar34 * 8 + -8);
            if (lVar6 != 0) {
              sVar17 = LZCOUNT(lVar6) - lVar23 ^ 0x3f;
              break;
            }
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        bVar28 = (byte)local_148._44_4_;
        for (; poVar18 = (this->super_Solver).logger, sVar17 != 0xffffffffffffffff;
            sVar17 = bitset::find_prev((bitset *)local_c8,sVar17)) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
          local_148._0_8_ = (this->super_Solver).game;
          local_148._8_4_ = (int)sVar17;
          poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
          if ((1 < (this->super_Solver).trace) &&
             ((((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)sVar17 >> 6] >>
                (sVar17 & 0x3f) & 1) == 0) != (bool)(bVar28 & 1))) {
            poVar18 = (this->super_Solver).logger;
            if (this->str[sVar17] == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,"\x1b[38;5;37m\x1b[33m=>\x1b[38;5;37m-\x1b[m",0x1f);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,"\x1b[33m=>\x1b[38;5;37m =>",0x14);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = this->str[sVar17];
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
          }
        }
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      piVar24 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8._96_8_ =
           (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c8._32_8_ = piVar24;
      if (piVar24 != (int *)local_c8._96_8_) {
        do {
          bVar13 = attracts(this,uVar14,*piVar24,(bitset *)local_c8,SG);
          if (!bVar13) goto LAB_0017ace3;
          piVar24 = piVar24 + 1;
        } while (piVar24 != (int *)local_c8._96_8_);
      }
      lVar23 = ((this->super_Solver).game)->n_vertices;
      if (lVar23 != 0) {
        memset(this->pea_vidx,0,lVar23 << 2);
      }
      this->pea_curidx = 1;
      if (local_c8._32_8_ != local_c8._96_8_) {
        local_148._64_8_ = &this->S;
        local_c8._56_8_ = &this->G;
        do {
          uVar26 = this->dominions;
          uVar5 = this->tangles;
          extractTangles(this,*(int *)local_c8._32_8_,(bitset *)local_c8);
          if (uVar26 != this->dominions) {
            sVar17 = (this->S)._bitssize;
            sVar20 = 0xffffffffffffffff;
            if (sVar17 != 0) {
              lVar23 = sVar17 * -0x40;
              do {
                lVar23 = lVar23 + 0x40;
                if ((*(uint64_t **)local_148._64_8_)[sVar17 - 1] != 0) {
                  sVar20 = LZCOUNT((*(uint64_t **)local_148._64_8_)[sVar17 - 1]) - lVar23 ^ 0x3f;
                  break;
                }
                sVar17 = sVar17 - 1;
              } while (sVar17 != 0);
            }
            for (; sVar20 != 0xffffffffffffffff;
                sVar20 = bitset::find_prev((bitset *)local_148._64_8_,sVar20)) {
              iVar16 = (this->Q).pointer;
              (this->Q).pointer = iVar16 + 1;
              (this->Q).queue[iVar16] = (uint)sVar20;
            }
            while( true ) {
              iVar16 = (this->Q).pointer;
              if ((long)iVar16 == 0) break;
              (this->Q).pointer = iVar16 + -1;
              uVar4 = (this->Q).queue[(long)iVar16 + -1];
              attractVertices(this,uVar14,uVar4,(bitset *)local_148._64_8_,(bitset *)local_c8._56_8_
                              ,(bitset *)local_c8._56_8_);
              attractTangles(this,uVar14,uVar4,(bitset *)local_c8._56_8_,(bitset *)local_148._64_8_,
                             (bitset *)local_c8._56_8_);
            }
            sVar17 = *(size_t *)(local_c8._64_8_ + 0x10);
            puVar33 = *(uint64_t **)local_148._64_8_;
            if (sVar17 != 0) {
              sVar20 = 0;
              puVar32 = *(uint64_t **)local_c8._64_8_;
              do {
                puVar32[sVar20] = puVar32[sVar20] | puVar33[sVar20];
                sVar20 = sVar20 + 1;
              } while (sVar17 != sVar20);
            }
            sVar17 = *(size_t *)(local_148._56_8_ + 0x10);
            if (sVar17 != 0) {
              sVar20 = 0;
              puVar32 = *(uint64_t **)local_148._56_8_;
              do {
                puVar32[sVar20] = puVar32[sVar20] & ~puVar33[sVar20];
                sVar20 = sVar20 + 1;
              } while (sVar17 != sVar20);
            }
            sVar17 = (this->G)._bitssize;
            if (sVar17 != 0) {
              sVar20 = 0;
              puVar32 = *(uint64_t **)local_c8._56_8_;
              do {
                puVar32[sVar20] = puVar32[sVar20] & ~puVar33[sVar20];
                sVar20 = sVar20 + 1;
              } while (sVar17 != sVar20);
            }
            sVar17 = (this->S)._bitssize;
            if (sVar17 != 0) {
              memset(puVar33,0,sVar17 << 3);
            }
          }
          if (((uVar26 != this->dominions) || (uVar5 != this->tangles)) &&
             (ppbVar21 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,
             (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
             super__Vector_impl_data._M_finish != ppbVar21)) {
            uVar34 = 0;
            do {
              R = ppbVar21[uVar34];
              local_d8 = (vector<int,std::allocator<int>> *)
                         CONCAT44(local_d8._4_4_,
                                  (((_Vector_base<int,_std::allocator<int>_> *)local_c8._104_8_)->
                                  _M_impl).super__Vector_impl_data._M_start[uVar34]);
              ppbVar7 = (((_Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_> *)
                         local_c8._112_8_)->_M_impl).super__Vector_impl_data._M_start;
              Z = ppbVar7[uVar34];
              local_148._0_8_ = (Game *)0x0;
              local_148._8_8_ = 0;
              local_148._16_8_ = (int *)0x0;
              local_148._24_8_ = (uint64_t *)0x0;
              local_c8._72_8_ = uVar34;
              if ((int)uVar34 == 0) {
                sVar17 = R->_bitssize;
                if (sVar17 != 0) {
                  puVar33 = R->_bits;
                  sVar20 = 0;
                  puVar32 = *(uint64_t **)local_c8._56_8_;
                  do {
                    puVar33[sVar20] = puVar33[sVar20] & puVar32[sVar20];
                    sVar20 = sVar20 + 1;
                  } while (sVar17 != sVar20);
                }
                local_c8._80_8_ = (this->G)._size;
                local_c8._88_8_ = (this->G)._bitssize;
                uVar34 = (this->G)._bitssize;
                local_148._48_8_ = uVar34 * 8;
                piVar24 = (int *)local_148._48_8_;
                if (0x1fffffffffffffff < uVar34) {
                  piVar24 = (int *)0xffffffffffffffff;
                }
                pvVar22 = operator_new__((ulong)piVar24);
                if (uVar34 != 0) {
                  memmove(pvVar22,*(uint64_t **)local_c8._56_8_,local_148._48_8_);
                  puVar33 = R->_bits;
                  uVar27 = 0;
                  do {
                    puVar3 = (ulong *)((long)pvVar22 + uVar27 * 8);
                    *puVar3 = *puVar3 & ~puVar33[uVar27];
                    uVar27 = uVar27 + 1;
                  } while (uVar34 != uVar27);
                }
                local_f8._size = local_c8._80_8_;
                local_f8._bitssize = local_c8._88_8_;
                local_f8._allocsize = local_148._48_8_;
                local_f8._bits = (uint64_t *)operator_new__((ulong)piVar24);
                if (uVar34 != 0) {
                  memcpy(local_f8._bits,pvVar22,local_148._48_8_);
                }
                operator_delete__(pvVar22);
                bitset::operator=((bitset *)local_148,(bitset *)(local_148 + 0x50));
                if ((Game *)local_f8._bits != (Game *)0x0) {
                  operator_delete__(local_f8._bits);
                }
              }
              else {
                uVar26 = (int)uVar34 - 1;
                pbVar8 = ppbVar21[uVar26];
                local_c8._120_8_ = ppbVar7[uVar26];
                local_48 = (int *)pbVar8->_size;
                piStack_40 = (int *)pbVar8->_bitssize;
                uVar34 = pbVar8->_bitssize;
                local_148._48_8_ = uVar34 * 8;
                local_c8._80_8_ = local_148._48_8_;
                if (0x1fffffffffffffff < uVar34) {
                  local_c8._80_8_ = (int *)0xffffffffffffffff;
                }
                pvVar22 = operator_new__(local_c8._80_8_);
                if (uVar34 != 0) {
                  memmove(pvVar22,pbVar8->_bits,local_148._48_8_);
                  uVar27 = 0;
                  puVar33 = *(uint64_t **)local_c8._120_8_;
                  do {
                    puVar3 = (ulong *)((long)pvVar22 + uVar27 * 8);
                    *puVar3 = *puVar3 & ~puVar33[uVar27];
                    uVar27 = uVar27 + 1;
                  } while (uVar34 != uVar27);
                }
                __dest = operator_new__(local_c8._80_8_);
                if (uVar34 != 0) {
                  memcpy(__dest,pvVar22,local_148._48_8_);
                }
                operator_delete__(pvVar22);
                sVar17 = R->_bitssize;
                if (sVar17 != 0) {
                  puVar33 = R->_bits;
                  sVar20 = 0;
                  do {
                    puVar33[sVar20] = puVar33[sVar20] & *(ulong *)((long)__dest + sVar20 * 8);
                    sVar20 = sVar20 + 1;
                  } while (sVar17 != sVar20);
                }
                pvVar22 = operator_new__(local_c8._80_8_);
                if (uVar34 != 0) {
                  memcpy(pvVar22,__dest,local_148._48_8_);
                  puVar33 = R->_bits;
                  uVar27 = 0;
                  do {
                    puVar3 = (ulong *)((long)pvVar22 + uVar27 * 8);
                    *puVar3 = *puVar3 & ~puVar33[uVar27];
                    uVar27 = uVar27 + 1;
                  } while (uVar34 != uVar27);
                }
                local_f8._size = (size_t)local_48;
                local_f8._bitssize = (size_t)piStack_40;
                local_f8._allocsize = local_148._48_8_;
                local_f8._bits = (uint64_t *)operator_new__(local_c8._80_8_);
                if (uVar34 != 0) {
                  memcpy(local_f8._bits,pvVar22,local_148._48_8_);
                }
                operator_delete__(pvVar22);
                bitset::operator=((bitset *)local_148,(bitset *)(local_148 + 0x50));
                if ((Game *)local_f8._bits != (Game *)0x0) {
                  operator_delete__(local_f8._bits);
                }
                operator_delete__(__dest);
              }
              sVar17 = 0xffffffffffffffff;
              if ((int *)local_148._16_8_ != (int *)0x0) {
                lVar23 = local_148._16_8_ * -0x40;
                piVar24 = (int *)local_148._16_8_;
                do {
                  lVar23 = lVar23 + 0x40;
                  lVar6 = *(long *)(local_148._0_8_ + (long)piVar24 * 8 + -8);
                  if (lVar6 != 0) {
                    sVar17 = LZCOUNT(lVar6) - lVar23 ^ 0x3f;
                    break;
                  }
                  piVar24 = (int *)((long)piVar24 - 1);
                } while (piVar24 != (int *)0x0);
              }
              local_d8 = (vector<int,std::allocator<int>> *)((ulong)local_d8 & 0xffffffff00000001);
              for (; sVar17 != 0xffffffffffffffff;
                  sVar17 = bitset::find_prev((bitset *)local_148,sVar17)) {
                iVar16 = (this->Q).pointer;
                (this->Q).pointer = iVar16 + 1;
                (this->Q).queue[iVar16] = (uint)sVar17;
              }
              uVar26 = (uint)local_d8 ^ 1;
              while( true ) {
                iVar16 = (this->Q).pointer;
                if ((long)iVar16 == 0) break;
                (this->Q).pointer = iVar16 + -1;
                uVar4 = (this->Q).queue[(long)iVar16 + -1];
                attractVertices(this,uVar26,uVar4,(bitset *)local_148,R,R);
                attractTangles(this,uVar26,uVar4,R,(bitset *)local_148,R);
              }
              sVar17 = R->_bitssize;
              if (sVar17 != 0) {
                puVar33 = R->_bits;
                sVar20 = 0;
                do {
                  puVar33[sVar20] = puVar33[sVar20] & ~((long *)local_148._0_8_)[sVar20];
                  sVar20 = sVar20 + 1;
                } while (sVar17 != sVar20);
              }
              lv = (_label_vertex *)(local_148 + 0x50);
              local_148._48_8_ = local_c8._48_8_;
              if ((uint)local_d8 == 0) {
                local_148._48_8_ = local_c8._40_8_;
              }
              sVar17 = ((bitset *)local_148._48_8_)->_bitssize;
              if (sVar17 != 0) {
                sVar20 = 0;
                puVar33 = ((bitset *)local_148._48_8_)->_bits;
                do {
                  puVar33[sVar20] = puVar33[sVar20] | ((long *)local_148._0_8_)[sVar20];
                  sVar20 = sVar20 + 1;
                } while (sVar17 != sVar20);
              }
              local_c8._80_8_ = local_c8._40_8_;
              if ((uint)local_d8 == 0) {
                local_c8._80_8_ = local_c8._48_8_;
              }
              sVar17 = ((bitset *)local_c8._80_8_)->_bitssize;
              if (sVar17 != 0) {
                sVar20 = 0;
                puVar33 = ((bitset *)local_c8._80_8_)->_bits;
                do {
                  puVar33[sVar20] = puVar33[sVar20] & ~((long *)local_148._0_8_)[sVar20];
                  sVar20 = sVar20 + 1;
                } while (sVar17 != sVar20);
              }
              if (1 < (this->super_Solver).trace) {
                poVar18 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[1;33mlevel ",0xd);
                poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-R\x1b[m",5);
                sVar17 = R->_bitssize;
                sVar20 = 0xffffffffffffffff;
                if (sVar17 != 0) {
                  lVar23 = sVar17 * -0x40;
                  do {
                    lVar23 = lVar23 + 0x40;
                    if (R->_bits[sVar17 - 1] != 0) {
                      sVar20 = LZCOUNT(R->_bits[sVar17 - 1]) - lVar23 ^ 0x3f;
                      break;
                    }
                    sVar17 = sVar17 - 1;
                  } while (sVar17 != 0);
                }
                for (; poVar18 = (this->super_Solver).logger, sVar20 != 0xffffffffffffffff;
                    sVar20 = bitset::find_prev(R,sVar20)) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
                  local_f8._bits = (uint64_t *)(this->super_Solver).game;
                  local_f8._size = CONCAT44(local_f8._size._4_4_,(int)sVar20);
                  poVar18 = operator<<(poVar18,lv);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
                }
                std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
                std::ostream::put((char)poVar18);
                std::ostream::flush();
                if (1 < (this->super_Solver).trace) {
                  poVar18 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[1;33mlevel ",0xd)
                  ;
                  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-U\x1b[m",5);
                  sVar17 = 0xffffffffffffffff;
                  if ((int *)local_148._16_8_ != (int *)0x0) {
                    lVar23 = local_148._16_8_ * -0x40;
                    piVar24 = (int *)local_148._16_8_;
                    do {
                      lVar23 = lVar23 + 0x40;
                      lVar6 = *(long *)(local_148._0_8_ + (long)piVar24 * 8 + -8);
                      if (lVar6 != 0) {
                        sVar17 = LZCOUNT(lVar6) - lVar23 ^ 0x3f;
                        break;
                      }
                      piVar24 = (int *)((long)piVar24 - 1);
                    } while (piVar24 != (int *)0x0);
                  }
                  for (; poVar18 = (this->super_Solver).logger, sVar17 != 0xffffffffffffffff;
                      sVar17 = bitset::find_prev((bitset *)local_148,sVar17)) {
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb)
                    ;
                    local_f8._bits = (uint64_t *)(this->super_Solver).game;
                    local_f8._size = CONCAT44(local_f8._size._4_4_,(int)sVar17);
                    poVar18 = operator<<(poVar18,lv);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
                  }
                  std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
                  std::ostream::put((char)poVar18);
                  std::ostream::flush();
                }
              }
              sVar17 = Z->_bitssize;
              sVar20 = 0xffffffffffffffff;
              if (sVar17 != 0) {
                puVar33 = R->_bits;
                puVar32 = Z->_bits;
                sVar31 = 0;
                do {
                  puVar3 = puVar32 + sVar31;
                  *puVar3 = *puVar3 & puVar33[sVar31];
                  sVar31 = sVar31 + 1;
                } while (sVar17 != sVar31);
                sVar17 = Z->_bitssize;
                if (sVar17 != 0) {
                  lVar23 = sVar17 * -0x40;
                  do {
                    lVar23 = lVar23 + 0x40;
                    uVar9 = puVar32[sVar17 - 1];
                    if (uVar9 != 0) {
                      sVar20 = LZCOUNT(uVar9) - lVar23 ^ 0x3f;
                      break;
                    }
                    sVar17 = sVar17 - 1;
                  } while (sVar17 != 0);
                }
              }
              for (; sVar20 != 0xffffffffffffffff; sVar20 = bitset::find_prev(Z,sVar20)) {
                iVar16 = (this->Q).pointer;
                (this->Q).pointer = iVar16 + 1;
                (this->Q).queue[iVar16] = (uint)sVar20;
              }
              while( true ) {
                iVar16 = (this->Q).pointer;
                if ((long)iVar16 == 0) break;
                (this->Q).pointer = iVar16 + -1;
                uVar4 = (this->Q).queue[(long)iVar16 + -1];
                attractVertices(this,(uint)local_d8,uVar4,Z,R,R);
                attractTangles(this,(uint)local_d8,uVar4,R,Z,R);
              }
              sVar17 = *(size_t *)(local_c8._80_8_ + 0x10);
              if (sVar17 != 0) {
                puVar33 = Z->_bits;
                puVar32 = *(uint64_t **)local_c8._80_8_;
                sVar20 = 0;
                do {
                  puVar32[sVar20] = puVar32[sVar20] | puVar33[sVar20];
                  sVar20 = sVar20 + 1;
                } while (sVar17 != sVar20);
              }
              sVar17 = *(size_t *)(local_148._48_8_ + 0x10);
              if (sVar17 != 0) {
                puVar33 = Z->_bits;
                puVar32 = *(uint64_t **)local_148._48_8_;
                sVar20 = 0;
                do {
                  puVar32[sVar20] = puVar32[sVar20] & ~puVar33[sVar20];
                  sVar20 = sVar20 + 1;
                } while (sVar17 != sVar20);
              }
              if (1 < (this->super_Solver).trace) {
                poVar18 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[1;33mlevel ",0xd);
                poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-H\x1b[m",5);
                sVar17 = Z->_bitssize;
                sVar20 = 0xffffffffffffffff;
                if (sVar17 != 0) {
                  lVar23 = sVar17 * -0x40;
                  do {
                    lVar23 = lVar23 + 0x40;
                    if (Z->_bits[sVar17 - 1] != 0) {
                      sVar20 = LZCOUNT(Z->_bits[sVar17 - 1]) - lVar23 ^ 0x3f;
                      break;
                    }
                    sVar17 = sVar17 - 1;
                  } while (sVar17 != 0);
                }
                for (; poVar18 = (this->super_Solver).logger, sVar20 != 0xffffffffffffffff;
                    sVar20 = bitset::find_prev(Z,sVar20)) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
                  local_f8._bits = (uint64_t *)(this->super_Solver).game;
                  local_f8._size = CONCAT44(local_f8._size._4_4_,(int)sVar20);
                  poVar18 = operator<<(poVar18,lv);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
                }
                std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
                std::ostream::put((char)poVar18);
                std::ostream::flush();
              }
              if ((Game *)local_148._0_8_ != (Game *)0x0) {
                operator_delete__((void *)local_148._0_8_);
              }
              ppbVar21 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              uVar34 = (ulong)((int)local_c8._72_8_ + 1);
            } while (uVar34 < (ulong)((long)(this->Rs).
                                            super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppbVar21 >> 3));
          }
          local_c8._32_8_ = local_c8._32_8_ + 4;
        } while (local_c8._32_8_ != local_c8._96_8_);
      }
LAB_0017ace3:
      piVar10 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar10) {
        (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar10;
      }
      sVar17 = *(size_t *)(local_c8._64_8_ + 0x10);
      if (sVar17 != 0) {
        puVar33 = SG->_bits;
        puVar32 = *(uint64_t **)local_c8._64_8_;
        sVar20 = 0;
        do {
          puVar32[sVar20] = puVar32[sVar20] & ~puVar33[sVar20];
          sVar20 = sVar20 + 1;
        } while (sVar17 != sVar20);
      }
      local_148._64_8_ = (ulong)(uVar14 << 5) + 0x1e0;
      if (1 < (this->super_Solver).trace) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;33mpre subgame \x1b[36m",0x18);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._44_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        if (-1 < iVar15) {
          uVar34 = local_158 & 0xffffffff;
          do {
            if ((((ulong)((long *)local_c8._0_8_)[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_148._56_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) == 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;46m",0xb);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = (int)uVar34;
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        if (-1 < iVar15) {
          uVar34 = local_158 & 0xffffffff;
          do {
            if (((SG->_bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               ((((long *)local_c8._0_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) == 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = (int)uVar34;
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        if (-1 < iVar15) {
          uVar34 = local_158 & 0xffffffff;
          do {
            uVar27 = uVar34 >> 6;
            if (((SG->_bits[uVar27] >> (uVar34 & 0x3f) & 1) != 0) &&
               (uVar29 = 1L << (uVar34 & 0x3f),
               ((*(uint64_t **)local_148._56_8_)[uVar27] & uVar29) != 0)) {
              poVar18 = (this->super_Solver).logger;
              if ((*(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_148._64_8_)
                             + uVar27 * 8) & uVar29) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;196m",0xc);
                local_148._0_8_ = (this->super_Solver).game;
                local_148._8_4_ = (int)uVar34;
                poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;202m",0xc);
                local_148._0_8_ = (this->super_Solver).game;
                local_148._8_4_ = (int)uVar34;
                poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
              }
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        poVar18 = (this->super_Solver).logger;
        cVar12 = (char)poVar18;
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + cVar12);
        std::ostream::put(cVar12);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;33mgame",0xb);
        uVar26 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar26) {
          uVar34 = (ulong)uVar26;
          do {
            if ((((this->G)._bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_c8._48_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) != 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;202m",0xc);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = (int)uVar34;
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        uVar26 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar26) {
          uVar34 = (ulong)uVar26;
          do {
            if ((((this->G)._bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_c8._40_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) != 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;201m",0xc);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = (int)uVar34;
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        uVar26 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar26) {
          uVar34 = (ulong)uVar26;
          do {
            uVar27 = uVar34 >> 6;
            if (((((this->G)._bits[uVar27] >> (uVar34 & 0x3f) & 1) != 0) &&
                (uVar29 = 1L << (uVar34 & 0x3f),
                ((*(uint64_t **)local_c8._48_8_)[uVar27] & uVar29) == 0)) &&
               (((*(uint64_t **)local_c8._40_8_)[uVar27] & uVar29) == 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
              local_148._0_8_ = (this->super_Solver).game;
              local_148._8_4_ = (int)uVar34;
              poVar18 = operator<<(poVar18,(_label_vertex *)local_148);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        poVar18 = (this->super_Solver).logger;
        cVar12 = (char)poVar18;
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + cVar12);
        std::ostream::put(cVar12);
        std::ostream::flush();
      }
      local_d8 = (vector<int,std::allocator<int>> *)SG->_size;
      piStack_d0 = (int *)SG->_bitssize;
      uVar34 = SG->_bitssize;
      puVar33 = (uint64_t *)(uVar34 * 8);
      puVar32 = (uint64_t *)0xffffffffffffffff;
      if (uVar34 < 0x2000000000000000) {
        puVar32 = puVar33;
      }
      pvVar22 = operator_new__((ulong)puVar32);
      if (uVar34 != 0) {
        memmove(pvVar22,SG->_bits,(size_t)puVar33);
        uVar27 = 0;
        do {
          puVar3 = (ulong *)((long)pvVar22 + uVar27 * 8);
          *puVar3 = *puVar3 ^ ((long *)local_c8._0_8_)[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar34 != uVar27);
      }
      local_148._8_8_ = local_d8;
      local_148._16_8_ = piStack_d0;
      local_148._24_8_ = puVar33;
      local_148._0_8_ = operator_new__((ulong)puVar32);
      if (uVar34 != 0) {
        memcpy((void *)local_148._0_8_,pvVar22,(size_t)puVar33);
      }
      operator_delete__(pvVar22);
      piVar24 = (int *)0x0;
      do {
        if ((int *)local_148._16_8_ == piVar24) goto LAB_0017b39a;
        ppuVar2 = (uint64_t **)local_148._0_8_ + (long)piVar24;
        piVar24 = (int *)((long)piVar24 + 1);
      } while (*ppuVar2 == (uint64_t *)0x0);
      local_f8._bits = (uint64_t *)local_148;
      std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
                ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Rs,
                 (bitset **)(local_148 + 0x50));
      solve(this,(bitset *)local_148,iVar15,local_148._76_4_,local_148._72_4_);
      piVar10 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppbVar21 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
      (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppbVar21;
      if ((ulong)((long)ppbVar21 -
                  (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <
          (ulong)((long)piVar10 -
                  (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar10 + -1;
      }
LAB_0017b39a:
      Z_00 = local_148._56_8_;
      pppbVar1 = &(this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppbVar1 = *pppbVar1 + -1;
      sVar17 = 0;
      puVar33 = SG->_bits;
      do {
        if (SG->_bitssize == sVar17) goto LAB_0017ba20;
        puVar32 = puVar33 + sVar17;
        sVar17 = sVar17 + 1;
      } while (*puVar32 == 0);
      if (-1 < iVar15) {
        puVar11 = (this->Q).queue;
        uVar34 = 0;
        do {
          if (((puVar33[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
             (((*(uint64_t **)local_148._56_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) != 0)) {
            iVar16 = (this->Q).pointer;
            (this->Q).pointer = iVar16 + 1;
            puVar11[iVar16] = (uint)uVar34;
          }
          uVar34 = uVar34 + 1;
        } while (iVar15 + 1 != uVar34);
      }
      iVar16 = (this->Q).pointer;
      if (iVar16 == 0) {
        local_d8 = (vector<int,std::allocator<int>> *)((ulong)local_d8._4_4_ << 0x20);
      }
      else {
        local_d8 = (vector<int,std::allocator<int>> *)((ulong)local_d8._4_4_ << 0x20);
        do {
          (this->Q).pointer = iVar16 + -1;
          uVar4 = (this->Q).queue[(long)iVar16 + -1];
          uVar34 = *(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_148._64_8_)
                             + ((ulong)(long)(int)uVar4 >> 6) * 8);
          attractVertices(this,uVar14 ^ 1,uVar4,(bitset *)Z_00,SG,SG);
          attractTangles(this,uVar14 ^ 1,uVar4,SG,(bitset *)Z_00,SG);
          local_d8 = (vector<int,std::allocator<int>> *)
                     CONCAT44(local_d8._4_4_,
                              CONCAT31((int3)((ulong)local_d8 >> 8),
                                       (byte)local_d8 |
                                       (uVar34 >> ((long)(int)uVar4 & 0x3fU) & 1) != 0));
          iVar16 = (this->Q).pointer;
        } while (iVar16 != 0);
      }
      if (1 < (this->super_Solver).trace) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;33mpost subgame \x1b[36m",0x19);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._44_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m (pe=",8);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._76_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," po=",4);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_148._72_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,")",1);
        uVar27 = local_158 & 0xffffffff;
        uVar34 = uVar27;
        if (-1 < iVar15) {
          do {
            if ((((ulong)((long *)local_c8._0_8_)[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_148._56_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) == 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
              local_f8._bits = (uint64_t *)(this->super_Solver).game;
              local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar34);
              poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        uVar34 = uVar27;
        if (-1 < iVar15) {
          do {
            uVar29 = uVar34 >> 6;
            if ((((SG->_bits[uVar29] >> (uVar34 & 0x3f) & 1) != 0) &&
                (uVar25 = 1L << (uVar34 & 0x3f), (((long *)local_c8._0_8_)[uVar29] & uVar25) == 0))
               && (((*(uint64_t **)local_148._56_8_)[uVar29] & uVar25) == 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;46m",0xb);
              local_f8._bits = (uint64_t *)(this->super_Solver).game;
              local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar34);
              poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        if (-1 < iVar15) {
          do {
            uVar34 = uVar27 >> 6;
            if (((SG->_bits[uVar34] >> (uVar27 & 0x3f) & 1) != 0) &&
               (uVar29 = 1L << (uVar27 & 0x3f),
               ((*(uint64_t **)local_148._56_8_)[uVar34] & uVar29) != 0)) {
              poVar18 = (this->super_Solver).logger;
              if ((*(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_148._64_8_)
                             + uVar34 * 8) & uVar29) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;196m",0xc);
                local_f8._bits = (uint64_t *)(this->super_Solver).game;
                local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar27);
                poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;202m",0xc);
                local_f8._bits = (uint64_t *)(this->super_Solver).game;
                local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar27);
                poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
              }
            }
            bVar13 = 0 < (long)uVar27;
            uVar27 = uVar27 - 1;
          } while (bVar13);
        }
        poVar18 = (this->super_Solver).logger;
        cVar12 = (char)poVar18;
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + cVar12);
        std::ostream::put(cVar12);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;33mgame\x1b[m",0xe);
        uVar26 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar26) {
          uVar34 = (ulong)uVar26;
          do {
            if ((((this->G)._bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_c8._48_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) != 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;202m",0xc);
              local_f8._bits = (uint64_t *)(this->super_Solver).game;
              local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar34);
              poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
        uVar26 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar26) {
          uVar34 = (ulong)uVar26;
          do {
            if ((((this->G)._bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) &&
               (((*(uint64_t **)local_c8._40_8_)[uVar34 >> 6] & 1L << (uVar34 & 0x3f)) != 0)) {
              poVar18 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;201m",0xc);
              local_f8._bits = (uint64_t *)(this->super_Solver).game;
              local_f8._size = CONCAT44(local_f8._size._4_4_,(int)uVar34);
              poVar18 = operator<<(poVar18,(_label_vertex *)(local_148 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
            }
            bVar13 = 0 < (long)uVar34;
            uVar34 = uVar34 - 1;
          } while (bVar13);
        }
        poVar18 = (this->super_Solver).logger;
        cVar12 = (char)poVar18;
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + cVar12);
        std::ostream::put(cVar12);
        std::ostream::flush();
      }
      if (((ulong)local_d8 & 1) != 0) {
        sVar17 = *(size_t *)(local_c8._64_8_ + 0x10);
        puVar33 = SG->_bits;
        if (sVar17 != 0) {
          puVar32 = *(uint64_t **)local_c8._64_8_;
          sVar20 = 0;
          do {
            puVar32[sVar20] = puVar32[sVar20] & ~puVar33[sVar20];
            sVar20 = sVar20 + 1;
          } while (sVar17 != sVar20);
          puVar33 = SG->_bits;
        }
        sVar17 = SG->_bitssize;
        if (sVar17 == 0) {
          sVar17 = 0;
        }
        else {
          puVar32 = *(uint64_t **)local_148._56_8_;
          sVar20 = 0;
          do {
            puVar33[sVar20] = puVar33[sVar20] & ~puVar32[sVar20];
            sVar20 = sVar20 + 1;
          } while (sVar17 != sVar20);
          sVar17 = SG->_bitssize;
        }
        sVar20 = 0;
        do {
          if (sVar17 == sVar20) goto LAB_0017ba20;
          puVar32 = puVar33 + sVar20;
          sVar20 = sVar20 + 1;
        } while (*puVar32 == 0);
        solve(this,SG,iVar15,(uint)local_148._76_4_ >> uVar14,
              (uint)local_148._72_4_ >> ((byte)uVar14 ^ 1));
      }
LAB_0017ba20:
      if ((Game *)local_148._0_8_ != (Game *)0x0) {
        operator_delete__((void *)local_148._0_8_);
      }
      if ((Game *)local_c8._0_8_ == (Game *)0x0) {
        return;
      }
      operator_delete__((void *)local_c8._0_8_);
      return;
    }
    sVar17 = (this->W1)._bitssize;
    if (sVar17 != 0) {
      puVar33 = (this->W1)._bits;
      sVar20 = 0;
      puVar32 = SG->_bits;
      do {
        puVar3 = puVar33 + sVar20;
        *puVar3 = *puVar3 | puVar32[sVar20];
        sVar20 = sVar20 + 1;
      } while (sVar17 != sVar20);
    }
    if ((this->super_Solver).trace < 2) {
      return;
    }
    sVar17 = 0;
    do {
      if (SG->_bitssize == sVar17) {
        return;
      }
      puVar33 = SG->_bits + sVar17;
      sVar17 = sVar17 + 1;
    } while (*puVar33 == 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"presumed won by player 1:",0x19);
    if (-1 < vtop) {
      uVar34 = (ulong)(uint)vtop;
      do {
        if ((SG->_bits[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0) {
          poVar18 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[38;5;38m",0xb);
          local_c8._0_8_ = (this->super_Solver).game;
          local_c8._8_4_ = (int)uVar34;
          poVar18 = operator<<(poVar18,(_label_vertex *)local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        }
        bVar13 = 0 < (long)uVar34;
        uVar34 = uVar34 - 1;
      } while (bVar13);
    }
  }
  poVar18 = (this->super_Solver).logger;
  cVar12 = (char)poVar18;
  std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + cVar12);
  std::ostream::put(cVar12);
  std::ostream::flush();
  return;
}

Assistant:

void
TLQSolver::solve(bitset &SG, int vtop, int pe, int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     */

    iterations++;  // record the number of recursive calls (visits)

    /**
     * If precision is 0 for a player, it means we are only looking for tangles of size <= 0,
     * that is, we presume everything is won by the other player.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Obtain the priority and player of the subgame
     */

    if (Ps.size() < Rs.size()) {
        Ps.push_back(priority(vtop));
        // optimisation when we enter this method for the first time!
        auto size = SG.count();
        while ((size_t)(po/2) > size) po/=2;
        while ((size_t)(pe/2) > size) pe/=2;
    }

    const int pr = Ps.back();
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Update vtop to the highest vertex in the intersection
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */

    bitset H(nodecount());
    Hs.push_back(&H);

    for (int v=vtop; v!=-1; v--) {
        if (!SG[v] || H[v]) continue;
        // if (priority(v) != pr) break; // stop attracting when we reach the next priority
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        heads.push_back(v);
        H[v] = true;
        str[v] = -1;
        Q.push(v);
        while (Q.nonempty()) {
            const int u = Q.pop();
            attractVertices(pl, u, H, SG, SG);
            attractTangles(pl, u, SG, H, SG);
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            if (trace >= 2) {
                if (owner(v) == pl) {
                    if (str[v] == -1) logger << "\033[38;5;37m\033[33m=>\033[38;5;37m-\033[m";
                    else logger << "\033[33m=>\033[38;5;37m =>" << label_vertex(str[v]) << "\033[m";
                }
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Now check if H has any escapes to R-H
     */

    bool leaky = false;
    for (auto v : heads) {
        if (!attracts(pl, v, H, SG)) {
            leaky = true;
            break;
            // TODO: consider learning tangles from partially leaky regions
        }
    }

    /**
     * If not leaky, then we can learn tangles from H
     */

    if (!leaky) {
        std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
        pea_curidx = 1;
        for (auto v : heads) {
            auto T = tangles, D = dominions;
            extractTangles(v, H);
            if (D != dominions) {
                // maximize the found dominions
                for (auto v = S.find_last(); v != bitset::npos; v = S.find_prev(v)) {
                    Q.push(v);
                }
                while (Q.nonempty()) {
                    const int u = Q.pop();
                    attractVertices(pl, u, S, G, G);
                    attractTangles(pl, u, G, S, G);
                }
                // remove them from the game
                Wm |= S;
                Wo -= S;
                G -= S;
                S.reset();
            }
            if (D != dominions or T != tangles) {
                // now we need to re-maximize all regions
                for (unsigned int k=0; k<Rs.size(); k++) {
                    int k_pr = Ps[k];
                    int k_pl = k_pr & 1;
                    bitset& k_R = *Rs[k];
                    bitset& k_H = *Hs[k];
                    bitset k_U;
                    // first: R[k] - H[k] >= R[k+1]
                    // and compute what remains of k_U
                    if (k == 0) {
                        k_R &= G;
                        k_U = G - k_R;
                    } else {
                        bitset SG = *Rs[k-1] - *Hs[k-1];
                        k_R &= SG;
                        k_U = SG - k_R;
                    }
                    // maximize k_U 
                    for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(1-k_pl, u, k_U, k_R, k_R);
                        attractTangles(1-k_pl, u, k_R, k_U, k_R);
                    }
                    k_R -= k_U;
                    (k_pl == 1 ? W0 : W1) |= k_U;
                    (k_pl == 1 ? W1 : W0) -= k_U;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-R\033[m";
                        for (auto v = k_R.find_last(); v != bitset::npos; v = k_R.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-U\033[m";
                        for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                    // maximize H
                    k_H &= k_R;
                    for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(k_pl, u, k_H, k_R, k_R);
                        attractTangles(k_pl, u, k_R, k_H, k_R);
                    }
                    (k_pl == 1 ? W1 : W0) |= k_H;
                    (k_pl == 1 ? W0 : W1) -= k_H;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-H\033[m";
                        for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                }
            }
        }
    }

    heads.clear();

    // Reset Wm for vertices not in SG
    Wm -= SG;

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpre subgame \033[36m" << pr << "\033[m";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && !W0[v] && !W1[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blue
        }
        logger << std::endl;
    }
#endif

    /**
     * Go recursive!
     */

    bitset R = SG ^ H;
    if (R.any()) {
        Rs.push_back(&R);
        solve(R, vtop, pe, po);
        Rs.pop_back();
        if (Ps.size() > Rs.size()) Ps.pop_back();
    }
    Hs.pop_back();

    if (SG.none()) return;

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */

    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (SG[v] and Wo[v]) {
            Q.push(v);
        }
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) opponent_attracted_from_us = true;
            attractVertices(1-pl, v, Wo, SG, SG);
            attractTangles(1-pl, v, SG, Wo, SG);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpost subgame \033[36m" << pr << "\033[m (pe=" << pe << " po=" << po << ")";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame\033[m";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side of the universal tree.
     * Also only do this if there is anything remaining in the subgame.
     */

    if (opponent_attracted_from_us) {
        Wm -= SG;  // reset Wm prior to recursion
        SG -= Wo;  // remove opponent won vertices from subgame

        if (SG.any()) {
            // Expand the right side of the current level of the universal tree
            if (pl == 0) solve(SG, vtop, pe, po/2);
            else solve(SG, vtop, pe/2, po);
        }
    }
}